

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1d841d::WriterThread::run(WriterThread *this)

{
  int iVar1;
  Mutex *in_RDI;
  int n;
  Lock lock;
  Lock *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  IlmThread_2_5::Semaphore::post();
  while( true ) {
    IlmThread_2_5::Lock::Lock
              ((Lock *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI,
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
    if ((anonymous_namespace)::remainingScanlines == 0) {
      iVar1 = 3;
    }
    else {
      in_stack_ffffffffffffffc0 =
           (Lock *)Imath_2_5::Rand48::nextf
                             ((Rand48 *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (double)in_RDI,(double)in_stack_ffffffffffffffc0);
      iVar1 = (int)((double)in_stack_ffffffffffffffc0 + 0.5);
      Imf_2_5::RgbaOutputFile::writePixels
                ((RgbaOutputFile *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      (anonymous_namespace)::remainingScanlines = (anonymous_namespace)::remainingScanlines - iVar1;
      iVar1 = 0;
    }
    IlmThread_2_5::Lock::~Lock(in_stack_ffffffffffffffc0);
    if (iVar1 != 0) break;
    in_stack_ffffffffffffffd0 = 0;
  }
  return;
}

Assistant:

void
WriterThread::run ()
{
    //
    // Signal that the thread has started
    //

    threadSemaphore.post();

    while (true)
    {
	Lock lock (scanlineMutex);

	if (remainingScanlines)
	{
	    int n = int (rand1.nextf (0.0f, remainingScanlines) + 0.5f);
	    _outfile->writePixels (n);
	    remainingScanlines -= n;
	}
	else
	{
	    break;
	}
    }
}